

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

Names * __thiscall
cmGeneratorTarget::GetExecutableNames
          (Names *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  cmMakefile *this_00;
  bool bVar1;
  TargetType TVar2;
  string *psVar3;
  bool local_175;
  string local_138;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  NameComponents *local_b8;
  NameComponents *components;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  cmValue local_60;
  cmValue version;
  string msg;
  string *config_local;
  cmGeneratorTarget *this_local;
  Names *targetNames;
  
  Names::Names(__return_storage_ptr__);
  bVar1 = IsImported(this);
  if (bVar1) {
    psVar3 = GetName_abi_cxx11_(this);
    cmStrCat<char_const(&)[47],std::__cxx11::string_const&>
              ((string *)&version,(char (*) [47])"GetExecutableNames called on imported target: ",
               psVar3);
    cmLocalGenerator::IssueMessage(this->LocalGenerator,INTERNAL_ERROR,(string *)&version);
    std::__cxx11::string::~string((string *)&version);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"VERSION",&local_81);
  local_60 = GetProperty(this,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  components._6_1_ = 0;
  components._5_1_ = 0;
  TVar2 = GetType(this);
  local_175 = true;
  if (TVar2 == EXECUTABLE) {
    this_00 = this->Makefile;
    std::allocator<char>::allocator();
    components._6_1_ = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"XCODE",(allocator<char> *)((long)&components + 7));
    components._5_1_ = 1;
    local_175 = cmMakefile::IsOn(this_00,&local_a8);
  }
  if ((components._5_1_ & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_a8);
  }
  if ((components._6_1_ & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)((long)&components + 7));
  }
  if (local_175 != false) {
    cmValue::operator=(&local_60,(nullptr_t)0x0);
  }
  local_b8 = GetFullNameInternalComponents(this,config,RuntimeBinaryArtifact);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_b8->base);
  std::operator+(&local_f8,&local_b8->prefix,&__return_storage_ptr__->Base);
  std::operator+(&local_d8,&local_f8,&local_b8->suffix);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->Output,(string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->Real,(string *)&__return_storage_ptr__->Output);
  bVar1 = cmValue::operator_cast_to_bool(&local_60);
  if (bVar1) {
    std::__cxx11::string::operator+=((string *)&__return_storage_ptr__->Real,"-");
    psVar3 = cmValue::operator*[abi_cxx11_(&local_60);
    std::__cxx11::string::operator+=((string *)&__return_storage_ptr__->Real,(string *)psVar3);
  }
  GetFullNameInternal(&local_118,this,config,ImportLibraryArtifact);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->ImportLibrary,(string *)&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->ImportReal,
             (string *)&__return_storage_ptr__->ImportLibrary);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->ImportOutput,
             (string *)&__return_storage_ptr__->ImportLibrary);
  GetPDBName(&local_138,this,config);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->PDB,(string *)&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  return __return_storage_ptr__;
}

Assistant:

cmGeneratorTarget::Names cmGeneratorTarget::GetExecutableNames(
  const std::string& config) const
{
  cmGeneratorTarget::Names targetNames;

  // This should not be called for imported targets.
  // TODO: Split cmTarget into a class hierarchy to get compile-time
  // enforcement of the limited imported target API.
  if (this->IsImported()) {
    std::string msg = cmStrCat(
      "GetExecutableNames called on imported target: ", this->GetName());
    this->LocalGenerator->IssueMessage(MessageType::INTERNAL_ERROR, msg);
  }

// This versioning is supported only for executables and then only
// when the platform supports symbolic links.
#if defined(_WIN32) && !defined(__CYGWIN__)
  cmValue version;
#else
  // Check for executable version properties.
  cmValue version = this->GetProperty("VERSION");
  if (this->GetType() != cmStateEnums::EXECUTABLE ||
      this->Makefile->IsOn("XCODE")) {
    version = nullptr;
  }
#endif

  // Get the components of the executable name.
  NameComponents const& components = this->GetFullNameInternalComponents(
    config, cmStateEnums::RuntimeBinaryArtifact);

  // The executable name.
  targetNames.Base = components.base;
  targetNames.Output =
    components.prefix + targetNames.Base + components.suffix;

// The executable's real name on disk.
#if defined(__CYGWIN__)
  targetNames.Real = components.prefix + targetNames.Base;
#else
  targetNames.Real = targetNames.Output;
#endif
  if (version) {
    targetNames.Real += "-";
    targetNames.Real += *version;
  }
#if defined(__CYGWIN__)
  targetNames.Real += components.suffix;
#endif

  // The import library name.
  targetNames.ImportLibrary =
    this->GetFullNameInternal(config, cmStateEnums::ImportLibraryArtifact);
  targetNames.ImportReal = targetNames.ImportLibrary;
  targetNames.ImportOutput = targetNames.ImportLibrary;

  // The program database file name.
  targetNames.PDB = this->GetPDBName(config);

  return targetNames;
}